

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

string * __thiscall
google::protobuf::FieldDescriptor::FieldTypeNameDebugString_abi_cxx11_
          (string *__return_storage_ptr__,FieldDescriptor *this)

{
  GoogleOnceDynamic *this_00;
  long lVar1;
  allocator local_11;
  
  if (*(GoogleOnceDynamic **)(this + 0x40) != (GoogleOnceDynamic *)0x0) {
    GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
              (*(GoogleOnceDynamic **)(this + 0x40),TypeOnceInit,this);
  }
  this_00 = *(GoogleOnceDynamic **)(this + 0x40);
  if (*(int *)(this + 0x48) == 0xe) {
    if (this_00 != (GoogleOnceDynamic *)0x0) {
      GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>(this_00,TypeOnceInit,this);
    }
    lVar1 = *(long *)(this + 0x78);
  }
  else {
    if (*(int *)(this + 0x48) != 0xb) {
      if (this_00 != (GoogleOnceDynamic *)0x0) {
        GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>(this_00,TypeOnceInit,this);
      }
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,
                 *(char **)(kTypeToName + (ulong)*(uint *)(this + 0x48) * 8),&local_11);
      return __return_storage_ptr__;
    }
    if (this_00 != (GoogleOnceDynamic *)0x0) {
      GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>(this_00,TypeOnceInit,this);
    }
    lVar1 = *(long *)(this + 0x70);
  }
  std::operator+(__return_storage_ptr__,".",
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(lVar1 + 8))
  ;
  return __return_storage_ptr__;
}

Assistant:

string FieldDescriptor::FieldTypeNameDebugString() const {
  switch(type()) {
    case TYPE_MESSAGE:
      return "." + message_type()->full_name();
    case TYPE_ENUM:
      return "." + enum_type()->full_name();
    default:
      return kTypeToName[type()];
  }
}